

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O3

int NbIdenticalCar(char *track,char *searched_string,int size_max)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  
  sVar4 = strlen(searched_string);
  if ((int)(uint)sVar4 < 1) {
    iVar6 = 0;
  }
  else {
    uVar5 = (ulong)((uint)sVar4 & 0x7fffffff);
    uVar8 = 0;
    iVar6 = 0;
    do {
      lVar9 = uVar5 - uVar8;
      if (0 < lVar9 && 0 < size_max) {
        uVar10 = 0;
        do {
          cVar2 = track[uVar10];
          iVar11 = (int)cVar2;
          cVar3 = searched_string[uVar10];
          iVar7 = (int)cVar3;
          bVar12 = iVar11 + 0x20 == iVar7;
          bVar13 = iVar7 + 0x20 == iVar11;
          uVar1 = uVar10 + 1;
          iVar7 = iVar6;
          if ((long)iVar6 <= (long)uVar10) {
            iVar7 = (int)uVar1;
          }
          if ((cVar2 == cVar3 || bVar12) || bVar13) {
            iVar6 = iVar7;
          }
        } while (((((long)uVar1 < (long)size_max) && (uVar10 < 7)) && ((long)uVar1 < lVar9)) &&
                (uVar10 = uVar1, (cVar2 == cVar3 || bVar12) || bVar13));
      }
      uVar8 = uVar8 + 1;
      searched_string = searched_string + 1;
    } while (uVar8 != uVar5);
  }
  return iVar6;
}

Assistant:

int NbIdenticalCar(const char* track, const char* searched_string, int size_max)
{
   int i = 0;
   int lg_max = strlen(searched_string);
   int nb_car_found = 0;

   for (int j = 0; j < lg_max; j++)
   {
      bool correct = true;
      for (i = 0; i < size_max && i < 8 && i < lg_max - j && correct; i++)
      {
         if (track[i] != searched_string[j + i]
            && track[i] + 0x20 != searched_string[j + i]
            && track[i] != searched_string[j + i] + 0x20)
         {
            correct = false;
         }
         else
         {
            if (i >= nb_car_found) nb_car_found = i + 1;
         }
      }
   }

   return nb_car_found;
}